

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.hpp
# Opt level: O3

handler_id_type __thiscall
handlebars::dispatcher<signals,std::__cxx11::string_const&>::
connect_member<logger*,void(logger::*)(std::__cxx11::string_const&)>
          (dispatcher<signals,std::__cxx11::string_const&> *this,signals *signal,logger **object,
          offset_in_logger_to_subr member)

{
  pointer *ppuVar1;
  uint uVar2;
  mapped_type *pmVar3;
  vector<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>,std::allocator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>>>
  *pvVar4;
  mapped_type *pmVar5;
  unsigned_long uVar6;
  handler_id_type hVar7;
  logger **local_40;
  offset_in_logger_to_subr local_38;
  
  local_40 = object;
  local_38 = member;
  pmVar3 = std::__detail::
           _Map_base<signals,_std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<signals,_std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                            ::m_unused_handler_storage_indices,(key_type *)this);
  uVar2 = *(uint *)this;
  if ((pmVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (pmVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    pmVar5 = std::__detail::
             _Map_base<signals,_std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>,_std::allocator<std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<signals,_std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>,_std::allocator<std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ::m_handler_map,(key_type *)this);
    uVar6 = ((long)(pmVar5->
                   super__Vector_base<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(pmVar5->
                   super__Vector_base<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
    pvVar4 = (vector<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>,std::allocator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>>>
              *)std::__detail::
                _Map_base<signals,_std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>,_std::allocator<std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<signals,_std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>,_std::allocator<std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                 ::m_handler_map,(key_type *)this);
    std::
    vector<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>,std::allocator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>>>
    ::emplace_back<std::in_place_t_const&,logger*,void(logger::*&)(std::__cxx11::string_const&)>
              (pvVar4,(in_place_t *)&std::in_place,(logger **)signal,
               (offset_in_logger_to_subr *)&local_40);
  }
  else {
    pmVar3 = std::__detail::
             _Map_base<signals,_std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<signals,_std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ::m_unused_handler_storage_indices,(key_type *)this);
    uVar6 = (pmVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish[-1];
    pmVar3 = std::__detail::
             _Map_base<signals,_std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<signals,_std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_signals,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ::m_unused_handler_storage_indices,(key_type *)this);
    ppuVar1 = &(pmVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + -1;
    pvVar4 = (vector<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>,std::allocator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>>>
              *)std::__detail::
                _Map_base<signals,_std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>,_std::allocator<std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<signals,_std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>,_std::allocator<std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                 ::m_handler_map,(key_type *)this);
    pmVar5 = std::__detail::
             _Map_base<signals,_std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>,_std::allocator<std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<signals,_std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>,_std::allocator<std::pair<const_signals,_std::vector<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<signals>,_std::hash<signals>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ::m_handler_map,(key_type *)this);
    std::
    vector<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>,std::allocator<std::optional<tmf::callable<void(std::__cxx11::string_const&),32ul>>>>
    ::_M_emplace_aux<std::in_place_t_const&,logger*,void(logger::*&)(std::__cxx11::string_const&)>
              (pvVar4,(pmVar5->
                      super__Vector_base<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>,_std::allocator<std::optional<tmf::callable<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_32UL>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar6,
               (in_place_t *)&std::in_place,(logger **)signal,(offset_in_logger_to_subr *)&local_40)
    ;
  }
  hVar7._4_4_ = 0;
  hVar7.signal = uVar2;
  hVar7.index = uVar6;
  return hVar7;
}

Assistant:

typename dispatcher<SignalT, HandlerArgTs...>::handler_id_type
				dispatcher<SignalT, HandlerArgTs...>::connect_member(const SignalT& signal, ClassT&& object, MemPtrT member)
		{
				handler_id_type handler_id;
				if (m_unused_handler_storage_indices[signal].size() > 0) {
						handler_id = { signal, m_unused_handler_storage_indices[signal].back() };
						m_unused_handler_storage_indices[signal].pop_back();
						m_handler_map[signal].emplace(
								m_handler_map[signal].begin() + handler_id.index, std::in_place, std::forward<ClassT>(object), member);
				}
				else {
						handler_id = { signal, m_handler_map[signal].size() };
						m_handler_map[signal].emplace_back(std::in_place, std::forward<ClassT>(object), member);
				}
				return handler_id;
		}